

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::PushPlotClipRect(float expand)

{
  ImPlotPlot *pIVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImRect rect;
  ImVec2 local_18;
  ImVec2 aIStack_10 [2];
  
  pIVar1 = GImPlot->CurrentPlot;
  IVar2 = (pIVar1->PlotRect).Min;
  IVar3 = (pIVar1->PlotRect).Max;
  local_18.x = IVar2.x;
  local_18.y = IVar2.y;
  local_18.y = local_18.y - expand;
  local_18.x = local_18.x - expand;
  aIStack_10[0].x = IVar3.x;
  aIStack_10[0].y = IVar3.y;
  aIStack_10[0].y = expand + aIStack_10[0].y;
  aIStack_10[0].x = aIStack_10[0].x + expand;
  if (pIVar1 != (ImPlotPlot *)0x0) {
    ImGui::PushClipRect(&local_18,aIStack_10,true);
    return;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"PushPlotClipRect() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xa6e,"void ImPlot::PushPlotClipRect(float)");
}

Assistant:

void PushPlotClipRect(float expand) {
    ImPlotContext& gp = *GImPlot;
    ImRect rect = gp.CurrentPlot->PlotRect;
    rect.Expand(expand);
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "PushPlotClipRect() needs to be called between BeginPlot() and EndPlot()!");
    ImGui::PushClipRect(rect.Min, rect.Max, true);
}